

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_isBaseUnitAllStandardUnits_Test::TestBody(Units_isBaseUnitAllStandardUnits_Test *this)

{
  byte bVar1;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var2;
  long lVar3;
  undefined4 *puVar4;
  string *psVar5;
  char *pcVar6;
  pointer pSVar7;
  initializer_list<libcellml::Units::StandardUnit> __l;
  initializer_list<unsigned_long> __l_00;
  AssertionResult gtest_ar_;
  string pre;
  string id;
  AssertHelper local_150 [8];
  Message local_148 [8];
  size_t index;
  UnitsPtr u;
  vector<unsigned_long,_std::allocator<unsigned_long>_> baseUnitIndices;
  UnitsPtr testUnit;
  vector<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
  standardUnits;
  char *local_e8 [4];
  string ref;
  double uExp;
  double expMult;
  
  puVar4 = &DAT_0014f3b8;
  psVar5 = &ref;
  for (lVar3 = 0x1f; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined4 *)&(psVar5->_M_dataplus)._M_p = *puVar4;
    puVar4 = puVar4 + 1;
    psVar5 = (string *)((long)&(psVar5->_M_dataplus)._M_p + 4);
  }
  __l._M_len = 0x1f;
  __l._M_array = (iterator)&ref;
  std::vector<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>::
  vector(&standardUnits,__l,(allocator_type *)&pre);
  ref.field_2._M_allocated_capacity = 4;
  ref.field_2._8_8_ = 0xc;
  ref._M_dataplus._M_p = (pointer)0x0;
  ref._M_string_length = 2;
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)&ref;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&baseUnitIndices,__l_00,(allocator_type *)&pre);
  pre._M_dataplus._M_p = (pointer)0x1f;
  id._M_dataplus._M_p =
       (pointer)((long)standardUnits.
                       super__Vector_base<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)standardUnits.
                       super__Vector_base<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 2);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&ref,"size_t(31)","standardUnits.size()",(unsigned_long *)&pre,
             (unsigned_long *)&id);
  if ((char)ref._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&pre);
    if (ref._M_string_length == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)ref._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&id,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x89a,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&id,(Message *)&pre);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&id);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&pre);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&ref._M_string_length);
  pre._M_dataplus._M_p = (pointer)0x8;
  id._M_dataplus._M_p =
       (pointer)((long)baseUnitIndices.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)baseUnitIndices.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&ref,"size_t(8)","baseUnitIndices.size()",(unsigned_long *)&pre,
             (unsigned_long *)&id);
  if ((char)ref._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&pre);
    if (ref._M_string_length == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)ref._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&id,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x89b,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&id,(Message *)&pre);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&id);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&pre);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&ref._M_string_length);
  libcellml::Units::create();
  ref._M_dataplus._M_p = (pointer)&ref.field_2;
  ref._M_string_length = 0;
  pre._M_dataplus._M_p = (pointer)&pre.field_2;
  pre._M_string_length = 0;
  ref.field_2._M_allocated_capacity = ref.field_2._M_allocated_capacity & 0xffffffffffffff00;
  pre.field_2._M_local_buf[0] = '\0';
  id._M_dataplus._M_p = (pointer)&id.field_2;
  id._M_string_length = 0;
  index = 0;
  id.field_2._M_local_buf[0] = '\0';
  pSVar7 = standardUnits.
           super__Vector_base<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pSVar7 == standardUnits.
                  super__Vector_base<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::~string((string *)&id);
      std::__cxx11::string::~string((string *)&pre);
      std::__cxx11::string::~string((string *)&ref);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&baseUnitIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
      ;
      std::
      _Vector_base<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
      ::~_Vector_base(&standardUnits.
                       super__Vector_base<libcellml::Units::StandardUnit,_std::allocator<libcellml::Units::StandardUnit>_>
                     );
      return;
    }
    libcellml::Units::addUnit
              ((StandardUnit)
               u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    libcellml::Units::unitAttributes
              ((ulong)u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               (string *)0x0,(string *)&ref,(double *)&pre,&uExp,(string *)&expMult);
    libcellml::Units::create((string *)&testUnit);
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                      (baseUnitIndices.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       baseUnitIndices.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish,&index);
    if (_Var2._M_current ==
        baseUnitIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar1 = libcellml::Units::isBaseUnit();
      gtest_ar_.success_ = (bool)(bVar1 ^ 1);
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (bVar1 != 0) {
        testing::Message::Message(local_148);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)local_e8,&gtest_ar_.success_,"testUnit->isBaseUnit()","true");
        testing::internal::AssertHelper::AssertHelper
                  (local_150,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
                   ,0x8ae,local_e8[0]);
        testing::internal::AssertHelper::operator=(local_150,local_148);
        goto LAB_00135a9a;
      }
    }
    else {
      gtest_ar_.success_ = (bool)libcellml::Units::isBaseUnit();
      gtest_ar_.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (gtest_ar_.success_ == false) {
        testing::Message::Message(local_148);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)local_e8,&gtest_ar_.success_,"testUnit->isBaseUnit()","false")
        ;
        testing::internal::AssertHelper::AssertHelper
                  (local_150,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
                   ,0x8ac,local_e8[0]);
        testing::internal::AssertHelper::operator=(local_150,local_148);
LAB_00135a9a:
        testing::internal::AssertHelper::~AssertHelper(local_150);
        std::__cxx11::string::~string((string *)local_e8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_148);
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    libcellml::Units::removeUnit
              ((StandardUnit)
               u.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    index = index + 1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&testUnit.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    pSVar7 = pSVar7 + 1;
  } while( true );
}

Assistant:

TEST(Units, isBaseUnitAllStandardUnits)
{
    const std::vector<libcellml::Units::StandardUnit> standardUnits = {
        libcellml::Units::StandardUnit::AMPERE,
        libcellml::Units::StandardUnit::BECQUEREL,
        libcellml::Units::StandardUnit::CANDELA,
        libcellml::Units::StandardUnit::COULOMB,
        libcellml::Units::StandardUnit::DIMENSIONLESS,
        libcellml::Units::StandardUnit::FARAD,
        libcellml::Units::StandardUnit::GRAM,
        libcellml::Units::StandardUnit::GRAY,
        libcellml::Units::StandardUnit::HENRY,
        libcellml::Units::StandardUnit::HERTZ,
        libcellml::Units::StandardUnit::JOULE,
        libcellml::Units::StandardUnit::KATAL,
        libcellml::Units::StandardUnit::KELVIN,
        libcellml::Units::StandardUnit::KILOGRAM,
        libcellml::Units::StandardUnit::LITRE,
        libcellml::Units::StandardUnit::LUMEN,
        libcellml::Units::StandardUnit::LUX,
        libcellml::Units::StandardUnit::METRE,
        libcellml::Units::StandardUnit::MOLE,
        libcellml::Units::StandardUnit::NEWTON,
        libcellml::Units::StandardUnit::OHM,
        libcellml::Units::StandardUnit::PASCAL,
        libcellml::Units::StandardUnit::RADIAN,
        libcellml::Units::StandardUnit::SECOND,
        libcellml::Units::StandardUnit::SIEMENS,
        libcellml::Units::StandardUnit::SIEVERT,
        libcellml::Units::StandardUnit::STERADIAN,
        libcellml::Units::StandardUnit::TESLA,
        libcellml::Units::StandardUnit::VOLT,
        libcellml::Units::StandardUnit::WATT,
        libcellml::Units::StandardUnit::WEBER,
    };

    const std::vector<size_t> baseUnitIndices = {0, 2, 4, 12, 13, 17, 18, 23};

    EXPECT_EQ(size_t(31), standardUnits.size());
    EXPECT_EQ(size_t(8), baseUnitIndices.size());

    libcellml::UnitsPtr u = libcellml::Units::create();
    std::string ref;
    std::string pre;
    std::string id;
    double expMult;
    double uExp;

    size_t index = 0;
    for (auto standardUnit : standardUnits) {
        u->addUnit(standardUnit);
        u->unitAttributes(0, ref, pre, uExp, expMult, id);

        libcellml::UnitsPtr testUnit = libcellml::Units::create(ref);
        auto found = std::find(baseUnitIndices.begin(), baseUnitIndices.end(), index);
        if (found != baseUnitIndices.end()) {
            EXPECT_TRUE(testUnit->isBaseUnit());
        } else {
            EXPECT_FALSE(testUnit->isBaseUnit());
        }

        u->removeUnit(standardUnit);
        index++;
    }
}